

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filesystem.cc
# Opt level: O1

void phosg::save_file(string *filename,void *data,size_t size)

{
  uint uVar1;
  size_t sVar2;
  uint *puVar3;
  runtime_error *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  scoped_fd fd;
  scoped_fd local_b4;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  scoped_fd::scoped_fd(&local_b4,filename,0x241,0x1ed);
  sVar2 = write(local_b4.fd,data,size);
  if (sVar2 == size) {
    scoped_fd::~scoped_fd(&local_b4);
    return;
  }
  puVar3 = (uint *)__errno_location();
  uVar1 = *puVar3;
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  if (uVar1 == 0) {
    string_printf_abi_cxx11_
              (&local_b0,"can\'t write to %s: %zd/%zd bytes written",(filename->_M_dataplus)._M_p,
               sVar2,size);
    ::std::runtime_error::runtime_error(this,(string *)&local_b0);
    __cxa_throw(this,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
  }
  ::std::operator+(&local_50,"can\'t write to ",filename);
  pbVar4 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_50
                      ,": ");
  local_90._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
  paVar5 = &pbVar4->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p == paVar5) {
    local_90.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
    local_90.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  }
  else {
    local_90.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
  }
  local_90._M_string_length = pbVar4->_M_string_length;
  (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
  pbVar4->_M_string_length = 0;
  (pbVar4->field_2)._M_local_buf[0] = '\0';
  string_for_error_abi_cxx11_(&local_70,(phosg *)(ulong)*puVar3,(int)local_90._M_string_length);
  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b0,
                   &local_90,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_70);
  ::std::runtime_error::runtime_error(this,(string *)&local_b0);
  __cxa_throw(this,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void save_file(const string& filename, const void* data, size_t size) {
  scoped_fd fd(filename, O_CREAT | O_TRUNC | O_WRONLY);
  ssize_t bytes_written = write(fd, data, size);
  if (bytes_written != static_cast<ssize_t>(size)) {
    if (errno == 0) {
      throw runtime_error(string_printf("can\'t write to %s: %zd/%zd bytes written",
          filename.c_str(), bytes_written, size));
    } else {
      throw runtime_error("can\'t write to " + filename + ": " + string_for_error(errno));
    }
  }
}